

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMan.c
# Opt level: O2

float Nwl_ManComputeTotalSwitching(Nwk_Man_t *pNtk)

{
  int *piVar1;
  Aig_Man_t *pAig;
  Vec_Int_t *__ptr;
  void *pvVar2;
  ulong uVar3;
  int i;
  float local_2c;
  
  pAig = Nwk_ManStrash(pNtk);
  __ptr = Saig_ManComputeSwitchProbs(pAig,0x30,0x10,0);
  piVar1 = __ptr->pArray;
  local_2c = 0.0;
  for (i = 0; i < pNtk->vObjs->nSize; i = i + 1) {
    pvVar2 = Vec_PtrEntry(pNtk->vObjs,i);
    if ((pvVar2 != (void *)0x0) &&
       (uVar3 = *(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe, uVar3 != 0)) {
      local_2c = local_2c +
                 (float)*(int *)((long)pvVar2 + 0x40) * (float)piVar1[*(int *)(uVar3 + 0x24)];
    }
  }
  free(__ptr->pArray);
  free(__ptr);
  Aig_ManStop(pAig);
  return local_2c;
}

Assistant:

float Nwl_ManComputeTotalSwitching( Nwk_Man_t * pNtk )
{
    extern Vec_Int_t * Saig_ManComputeSwitchProbs( Aig_Man_t * p, int nFrames, int nPref, int fProbOne );
    Vec_Int_t * vSwitching;
    float * pSwitching;
    Aig_Man_t * pAig;
    Aig_Obj_t * pObjAig;
    Nwk_Obj_t * pObjAbc;
    float Result = (float)0;
    int i;
    // strash the network
    // map network into an AIG
    pAig = Nwk_ManStrash( pNtk );
    vSwitching = Saig_ManComputeSwitchProbs( pAig, 48, 16, 0 );
    pSwitching = (float *)vSwitching->pArray;
    Nwk_ManForEachObj( pNtk, pObjAbc, i )
    {
        if ( (pObjAig = Aig_Regular((Aig_Obj_t *)pObjAbc->pCopy)) )
            Result += Nwk_ObjFanoutNum(pObjAbc) * pSwitching[pObjAig->Id];
    }
    Vec_IntFree( vSwitching );
    Aig_ManStop( pAig );
    return Result;
}